

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_39d8::ProfileHandlerTest::VerifyDisabled(ProfileHandlerTest *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertHelper local_60;
  undefined1 local_58 [8];
  ProfileHandlerState state;
  unsigned_long local_38;
  uint64_t interrupts_before;
  AssertHelper local_28;
  AssertHelper local_20;
  uint64_t interrupts_after;
  
  local_20.data_ = local_20.data_ & 0xffffffff00000000;
  ProfileHandlerGetState((ProfileHandlerState *)local_58);
  local_58._0_4_ = local_58._4_4_;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_38,"0","GetCallbackCount()",(int *)&local_20,(uint *)local_58);
  if (local_38._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (interrupts_before == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)interrupts_before;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  if (interrupts_before != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&interrupts_before,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 interrupts_before);
  }
  bVar1 = IsTimerEnabled();
  local_38 = CONCAT71(local_38._1_7_,!bVar1);
  interrupts_before = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)&local_38,(AssertionResult *)0x13c1df,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x133,(char *)CONCAT44(local_58._4_4_,local_58._0_4_));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::_M_dispose();
    if (local_20.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_20.data_ + 8))();
    }
  }
  if (interrupts_before != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&interrupts_before,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 interrupts_before);
  }
  ProfileHandlerGetState((ProfileHandlerState *)local_58);
  local_38._0_4_ = state.frequency;
  local_38._4_4_ = state.callback_count;
  Delay(200000000);
  ProfileHandlerGetState((ProfileHandlerState *)local_58);
  local_20.data_ = (AssertHelperData *)state._0_8_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_58,"interrupts_before","interrupts_after",&local_38,
             (unsigned_long *)&local_20);
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (state._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)state._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profile-handler_unittest.cc"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_28.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_28.data_ + 8))();
    }
  }
  if (state._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&state,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)state._0_8_);
  }
  return;
}

Assistant:

void VerifyDisabled() {
    // Check that the callback count is 0.
    EXPECT_EQ(0, GetCallbackCount());
    // Check that the timer is disabled.
    EXPECT_FALSE(IsTimerEnabled());
    // Verify that the ProfileHandler is not accumulating profile ticks.
    uint64_t interrupts_before = GetInterruptCount();
    Delay(kSleepInterval);
    uint64_t interrupts_after = GetInterruptCount();
    EXPECT_EQ(interrupts_before, interrupts_after);
  }